

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O1

void core::image::anon_unknown_7::load_png_headers_intern
               (FILE *fp,ImageHeaders *headers,png_structp *png,png_infop *png_info)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  png_structp ppVar4;
  png_infop ppVar5;
  Exception *pEVar6;
  ImageType IVar7;
  undefined1 local_50 [8];
  png_byte signature [8];
  undefined1 local_38 [16];
  
  sVar3 = fread(local_50,1,8,(FILE *)fp);
  if (sVar3 != 8) {
    fclose((FILE *)fp);
    pEVar6 = (Exception *)__cxa_allocate_exception(0x28);
    signature = (png_byte  [8])local_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)signature,"PNG signature could not be read","");
    util::Exception::Exception(pEVar6,(string *)signature);
    __cxa_throw(pEVar6,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  iVar2 = png_sig_cmp(local_50,0,8);
  if (iVar2 != 0) {
    fclose((FILE *)fp);
    pEVar6 = (Exception *)__cxa_allocate_exception(0x28);
    signature = (png_byte  [8])local_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)signature,"PNG signature did not match","");
    util::Exception::Exception(pEVar6,(string *)signature);
    __cxa_throw(pEVar6,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  ppVar4 = (png_structp)png_create_read_struct("1.6.37",0,0,0);
  *png = ppVar4;
  if (ppVar4 == (png_structp)0x0) {
    fclose((FILE *)fp);
    pEVar6 = (Exception *)__cxa_allocate_exception(0x28);
    signature = (png_byte  [8])local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)signature,"Out of memory","");
    util::Exception::Exception(pEVar6,(string *)signature);
    __cxa_throw(pEVar6,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  ppVar5 = (png_infop)png_create_info_struct(ppVar4);
  *png_info = ppVar5;
  if (ppVar5 != (png_infop)0x0) {
    png_init_io(*png,fp);
    png_set_sig_bytes(*png,8);
    png_read_info(*png,*png_info);
    iVar2 = png_get_image_width(*png,*png_info);
    headers->width = iVar2;
    iVar2 = png_get_image_height(*png,*png_info);
    headers->height = iVar2;
    bVar1 = png_get_channels(*png,*png_info);
    headers->channels = (uint)bVar1;
    bVar1 = png_get_bit_depth(*png,*png_info);
    IVar7 = IMAGE_TYPE_UINT8;
    if ((8 < bVar1) && (IVar7 = IMAGE_TYPE_UINT16, bVar1 != 0x10)) {
      png_destroy_read_struct(png,png_info,0);
      fclose((FILE *)fp);
      pEVar6 = (Exception *)__cxa_allocate_exception(0x28);
      signature = (png_byte  [8])local_38;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)signature,"PNG with unknown bit depth","");
      util::Exception::Exception(pEVar6,(string *)signature);
      __cxa_throw(pEVar6,&util::Exception::typeinfo,util::Exception::~Exception);
    }
    headers->type = IVar7;
    return;
  }
  png_destroy_read_struct(png,0,0);
  fclose((FILE *)fp);
  pEVar6 = (Exception *)__cxa_allocate_exception(0x28);
  signature = (png_byte  [8])local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)signature,"Out of memory","");
  util::Exception::Exception(pEVar6,(string *)signature);
  __cxa_throw(pEVar6,&util::Exception::typeinfo,util::Exception::~Exception);
}

Assistant:

void
    load_png_headers_intern (FILE* fp, ImageHeaders* headers,
        png_structp* png, png_infop* png_info)
    {
        /* Identify the PNG signature. */
        png_byte signature[8];
        if (std::fread(signature, 1, 8, fp) != 8)
        {
            std::fclose(fp);
            throw util::Exception("PNG signature could not be read");
        }
        if (png_sig_cmp(signature, 0, 8) != 0)
        {
            std::fclose(fp);
            throw util::Exception("PNG signature did not match");
        }

        /* Initialize PNG structures. */
        *png = png_create_read_struct(PNG_LIBPNG_VER_STRING,
            nullptr, nullptr, nullptr);
        if (!*png)
        {
            std::fclose(fp);
            throw util::Exception("Out of memory");
        }

        *png_info = png_create_info_struct(*png);
        if (!*png_info)
        {
            png_destroy_read_struct(png, nullptr, nullptr);
            std::fclose(fp);
            throw util::Exception("Out of memory");
        }

        /* Init PNG file IO */
        png_init_io(*png, fp);
        png_set_sig_bytes(*png, 8);

        /* Read PNG header info. */
        png_read_info(*png, *png_info);

        headers->width = png_get_image_width(*png, *png_info);
        headers->height = png_get_image_height(*png, *png_info);
        headers->channels = png_get_channels(*png, *png_info);

        int const bit_depth = png_get_bit_depth(*png, *png_info);
        if (bit_depth <= 8)
            headers->type = IMAGE_TYPE_UINT8;
        else if (bit_depth == 16)
            headers->type = IMAGE_TYPE_UINT16;
        else
        {
            png_destroy_read_struct(png, png_info, nullptr);
            std::fclose(fp);
            throw util::Exception("PNG with unknown bit depth");
        }
    }